

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void(std::error_code_const&)>::
callback<cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::http,cppcms::impl::cgi::http_creator>::accept_binder>
          (callback<void_(const_std::error_code_&)> *this,accept_binder func)

{
  accept_binder f;
  callable_impl<void,_cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::http,_cppcms::impl::cgi::http_creator>::accept_binder>
  *in_RDI;
  callable<void_(const_std::error_code_&)> *in_stack_ffffffffffffffd8;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *in_stack_ffffffffffffffe0;
  
  f.self = (socket_acceptor<cppcms::impl::cgi::http,_cppcms::impl::cgi::http_creator> *)
           operator_new(0x18);
  callback<void_(const_std::error_code_&)>::
  callable_impl<void,_cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::http,_cppcms::impl::cgi::http_creator>::accept_binder>
  ::callable_impl(in_RDI,f);
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,SUB81((ulong)f.self >> 0x38,0));
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}